

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deliminator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Deliminator::Optimize
          (Deliminator *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  string *__src;
  pointer *ppJVar1;
  LogicalComparisonJoin *delim_join;
  Expression *pEVar2;
  _func_int **pp_Var3;
  BaseStatistics *pBVar4;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var5;
  pointer pJVar6;
  pointer puVar7;
  pointer puVar8;
  long lVar9;
  Expression *pEVar10;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var11;
  bool bVar12;
  ulong uVar13;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  byte bVar14;
  __normal_iterator<duckdb::JoinWithDelimGet_*,_std::vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>_>
  __i;
  Expression *pEVar15;
  pointer *__ptr;
  pointer puVar16;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  Expression *pEVar17;
  iterator __begin1;
  pointer pDVar18;
  JoinWithDelimGet *join;
  pointer pJVar19;
  bool all_equality_conditions;
  vector<duckdb::DelimCandidate,_true> candidates;
  bool local_61;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_60;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_58;
  pointer local_50;
  vector<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_> local_48;
  
  (op->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (in_RDX->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00._M_head_impl = (Expression *)op;
  local_60 = in_RDX;
  local_58._M_head_impl = (LogicalOperator *)this;
  FindCandidates((Deliminator *)op,in_RDX,(vector<duckdb::DelimCandidate,_true> *)&local_48);
  local_50 = local_48.
             super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  pDVar18 = local_48.
            super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      delim_join = pDVar18->delim_join;
      pEVar17 = (Expression *)
                (pDVar18->joins).
                super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
                super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar2 = (Expression *)
               (pDVar18->joins).
               super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
               super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pEVar17 != pEVar2) {
        uVar13 = (long)pEVar2 - (long)pEVar17 >> 4;
        lVar9 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        ::std::
        __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::JoinWithDelimGet*,std::vector<duckdb::JoinWithDelimGet,std::allocator<duckdb::JoinWithDelimGet>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::Deliminator::Optimize(duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>)::__0>>
                  (pEVar17,pEVar2,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)pEVar2 - (long)pEVar17 < 0x101) {
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::JoinWithDelimGet*,std::vector<duckdb::JoinWithDelimGet,std::allocator<duckdb::JoinWithDelimGet>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::Deliminator::Optimize(duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>)::__0>>
                    (pEVar17,pEVar2);
          this_00._M_head_impl = pEVar17;
        }
        else {
          pEVar15 = (Expression *)&pEVar17[2].verification_stats;
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::JoinWithDelimGet*,std::vector<duckdb::JoinWithDelimGet,std::allocator<duckdb::JoinWithDelimGet>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::Deliminator::Optimize(duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>)::__0>>
                    (pEVar17,pEVar15);
          for (; this_00._M_head_impl = pEVar17, pEVar15 != pEVar2;
              pEVar15 = (Expression *)&(pEVar15->super_BaseExpression).alias) {
            pp_Var3 = (pEVar15->super_BaseExpression)._vptr_BaseExpression;
            pBVar4 = *(BaseStatistics **)&(pEVar15->super_BaseExpression).type;
            _Var5._M_head_impl =
                 pEVar15[-1].verification_stats.
                 super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                 .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
            pEVar10 = pEVar15;
            while (_Var5._M_head_impl < pBVar4) {
              _Var5._M_head_impl =
                   pEVar10[-1].verification_stats.
                   super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                   .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
              (pEVar10->super_BaseExpression)._vptr_BaseExpression =
                   (_func_int **)
                   pEVar10[-1].return_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
              *(BaseStatistics **)&(pEVar10->super_BaseExpression).type = _Var5._M_head_impl;
              _Var5._M_head_impl =
                   (BaseStatistics *)
                   pEVar10[-1].return_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              pEVar10 = (Expression *)
                        &pEVar10[-1].return_type.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
            }
            (pEVar10->super_BaseExpression)._vptr_BaseExpression = pp_Var3;
            *(BaseStatistics **)&(pEVar10->super_BaseExpression).type = pBVar4;
          }
        }
      }
      bVar14 = 1;
      if (((pDVar18->joins).
           super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
           super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (pDVar18->joins).
           super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
           super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         (this_00._M_head_impl = (Expression *)op,
         bVar12 = HasSelection((Deliminator *)op,(LogicalOperator *)delim_join), bVar12)) {
        this_00._M_head_impl =
             (Expression *)
             (pDVar18->joins).
             super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
             super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
             ._M_impl.super__Vector_impl_data._M_start;
        pJVar19 = (pDVar18->joins).
                  super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
                  super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __src = &((this_00._M_head_impl)->super_BaseExpression).alias;
        if (__src != (string *)pJVar19) {
          memmove(this_00._M_head_impl,__src,(long)pJVar19 - (long)__src);
        }
        ppJVar1 = &(pDVar18->joins).
                   super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                   .
                   super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppJVar1 = *ppJVar1 + -1;
        bVar14 = 0;
      }
      local_61 = true;
      pJVar6 = (pDVar18->joins).
               super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
               super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pJVar19 = (pDVar18->joins).
                     super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                     .
                     super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                     ._M_impl.super__Vector_impl_data._M_start; pJVar19 != pJVar6;
          pJVar19 = pJVar19 + 1) {
        this_00._M_head_impl = (Expression *)op;
        bVar12 = RemoveJoinWithDelimGet
                           ((Deliminator *)op,delim_join,pDVar18->delim_get_count,
                            (pJVar19->join)._M_data,&local_61);
        bVar14 = bVar14 & bVar12;
      }
      if (((long)(pDVar18->joins).
                 super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
                 super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pDVar18->joins).
                 super_vector<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>.
                 super__Vector_base<duckdb::JoinWithDelimGet,_std::allocator<duckdb::JoinWithDelimGet>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4 == pDVar18->delim_get_count) &&
         (bVar14 != 0)) {
        (delim_join->super_LogicalJoin).super_LogicalOperator.type = LOGICAL_COMPARISON_JOIN;
        puVar7 = (delim_join->duplicate_eliminated_columns).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar8 = (delim_join->duplicate_eliminated_columns).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar16 = puVar7;
        if (puVar8 != puVar7) {
          do {
            this_00._M_head_impl =
                 (puVar16->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            if (this_00._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(this_00._M_head_impl)->super_BaseExpression + 8))();
            }
            (puVar16->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            puVar16 = puVar16 + 1;
          } while (puVar16 != puVar8);
          (delim_join->duplicate_eliminated_columns).
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar7;
        }
      }
      if ((delim_join->super_LogicalJoin).super_LogicalOperator.field_0x61 == '\b') {
        TrySwitchSingleToLeft((Deliminator *)this_00._M_head_impl,delim_join);
      }
      pDVar18 = pDVar18 + 1;
    } while (pDVar18 != local_50);
  }
  _Var11._M_head_impl = local_58._M_head_impl;
  *(LogicalOperator **)local_58._M_head_impl =
       (local_60->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (local_60->
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  ::std::vector<duckdb::DelimCandidate,_std::allocator<duckdb::DelimCandidate>_>::~vector(&local_48)
  ;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )_Var11._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Deliminator::Optimize(unique_ptr<LogicalOperator> op) {
	root = op;

	vector<DelimCandidate> candidates;
	FindCandidates(op, candidates);

	if (candidates.empty()) {
		return op;
	}

	for (auto &candidate : candidates) {
		auto &delim_join = candidate.delim_join;

		// Sort these so the deepest are first
		std::sort(candidate.joins.begin(), candidate.joins.end(),
		          [](const JoinWithDelimGet &lhs, const JoinWithDelimGet &rhs) { return lhs.depth > rhs.depth; });

		bool all_removed = true;
		if (!candidate.joins.empty() && HasSelection(delim_join)) {
			// Keep the deepest join with DelimGet in these cases,
			// as the selection can greatly reduce the cost of the RHS child of the DelimJoin
			candidate.joins.erase(candidate.joins.begin());
			all_removed = false;
		}

		bool all_equality_conditions = true;
		for (auto &join : candidate.joins) {
			all_removed = RemoveJoinWithDelimGet(delim_join, candidate.delim_get_count, join.join.get(),
			                                     all_equality_conditions) &&
			              all_removed;
		}

		// Change type if there are no more duplicate-eliminated columns
		if (candidate.joins.size() == candidate.delim_get_count && all_removed) {
			delim_join.type = LogicalOperatorType::LOGICAL_COMPARISON_JOIN;
			delim_join.duplicate_eliminated_columns.clear();
		}

		// Only DelimJoins are ever created as SINGLE joins,
		// and we can switch from SINGLE to LEFT if the RHS is de-duplicated by an aggr
		if (delim_join.join_type == JoinType::SINGLE) {
			TrySwitchSingleToLeft(delim_join);
		}
	}

	return op;
}